

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strcasecmp(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint iValue;
  undefined8 in_RAX;
  char *zLeft;
  char *zRight;
  int n2;
  int n1;
  undefined8 local_28;
  
  if (nArg < 2) {
    iValue = (uint)(nArg != 0);
  }
  else {
    local_28 = in_RAX;
    zLeft = jx9_value_to_string(*apArg,(int *)((long)&local_28 + 4));
    zRight = jx9_value_to_string(apArg[1],(int *)&local_28);
    if ((int)(sxu32)local_28 < (int)local_28._4_4_) {
      local_28._0_4_ = local_28._4_4_;
    }
    iValue = SyStrnicmp(zLeft,zRight,(sxu32)local_28);
  }
  jx9_result_int(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_strcasecmp(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *z1, *z2;
	int n1, n2;
	int res;
	if( nArg < 2 ){
		res = nArg == 0 ? 0 : 1;
		jx9_result_int(pCtx, res);
		return JX9_OK;
	}
	/* Perform the comparison */
	z1 = jx9_value_to_string(apArg[0], &n1);
	z2 = jx9_value_to_string(apArg[1], &n2);
	res = SyStrnicmp(z1, z2, (sxu32)(SXMAX(n1, n2)));
	/* Comparison result */
	jx9_result_int(pCtx, res);
	return JX9_OK;
}